

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::select_write(socket_t sock,time_t sec,time_t usec)

{
  anon_class_24_3_42bc4be6 fn;
  time_t local_c8;
  timeval tv;
  fd_set *__arr;
  uint __i;
  fd_set fds;
  time_t usec_local;
  time_t sec_local;
  ssize_t sStack_10;
  socket_t sock_local;
  
  sec_local._4_4_ = sock;
  fds.fds_bits[0xf] = usec;
  if (sock < 0x400) {
    tv.tv_usec = (__suseconds_t)&stack0xffffffffffffff58;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      *(undefined8 *)(tv.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
    }
    *(ulong *)(&stack0xffffffffffffff58 + (long)(sock / 0x40) * 8) =
         1L << ((byte)((long)sock % 0x40) & 0x3f) |
         *(ulong *)(&stack0xffffffffffffff58 + (long)(sock / 0x40) * 8);
    tv.tv_sec = fds.fds_bits[0xf];
    fn.fds = (fd_set *)&local_c8;
    fn.sock = (socket_t *)&stack0xffffffffffffff58;
    fn.tv = (timeval *)((long)&sec_local + 4);
    local_c8 = sec;
    sStack_10 = handle_EINTR<httplib::detail::select_write(int,long,long)::_lambda()_1_>(fn);
  }
  else {
    sStack_10 = 1;
  }
  return sStack_10;
}

Assistant:

inline ssize_t select_write(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
  struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLOUT;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  return handle_EINTR([&]() { return poll(&pfd_read, 1, timeout); });
#else
#ifndef _WIN32
  if (sock >= FD_SETSIZE) { return 1; }
#endif

  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  timeval tv;
  tv.tv_sec = static_cast<long>(sec);
  tv.tv_usec = static_cast<decltype(tv.tv_usec)>(usec);

  return handle_EINTR([&]() {
    return select(static_cast<int>(sock + 1), nullptr, &fds, nullptr, &tv);
  });
#endif
}